

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel.cpp
# Opt level: O1

int64_t primecount::pi_lmo_parallel(int64_t x,int threads,bool is_print)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  double dVar6;
  double dVar7;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 sum_approx [16];
  undefined1 res_00 [16];
  byte bVar8;
  long *plVar9;
  uchar *puVar10;
  uint *puVar11;
  int *piVar12;
  int *piVar13;
  int64_t iVar14;
  int64_t segment_size;
  bool bVar15;
  ulong uVar16;
  int64_t iVar17;
  ulong uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  long lVar21;
  ulong uVar22;
  maxint_t *pmVar23;
  long res;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  uint64_t uVar27;
  ulong uVar28;
  int iVar29;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  uint64_t low;
  uint64_t uVar30;
  ulong uVar31;
  uint64_t i;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  uint64_t uVar35;
  long lVar36;
  ulong uVar37;
  uint64_t uVar38;
  ulong uVar39;
  uint64_t uVar40;
  uint64_t uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  string_view_t str;
  string_view_t str_00;
  string_view_t str_01;
  string_view_t str_02;
  string_view_t str_03;
  string_view_t str_04;
  string_view_t str_05;
  undefined8 in_stack_fffffffffffff8a8;
  long in_stack_fffffffffffff8b0;
  long lVar44;
  ulong local_6f8;
  type primes;
  long local_678;
  Vector<long,_std::allocator<long>_> phi;
  Sieve local_640;
  double local_5b0;
  long local_5a8;
  double local_5a0;
  ulong local_598;
  uint64_t local_590;
  ulong local_588;
  long local_580;
  uint *local_578;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  PiTable pi;
  ThreadData local_508;
  LoadBalancerS2 loadBalancer;
  char *extraout_RDX;
  
  if (x < 2) {
    lVar25 = 0;
  }
  else {
    uVar18 = (ulong)(uint)threads;
    x_01._8_8_ = in_stack_fffffffffffff8b0;
    x_01._0_8_ = in_stack_fffffffffffff8a8;
    dVar6 = get_alpha_lmo((primecount *)x,(maxint_t)x_01);
    dVar7 = cbrt((double)x);
    uVar24 = (ulong)dVar7;
    if (0 < (long)uVar24) {
      do {
        if (uVar24 * uVar24 - (ulong)x / uVar24 == 0 ||
            (long)(uVar24 * uVar24) < (long)((ulong)x / uVar24)) goto LAB_0011cd64;
        bVar15 = 1 < (long)uVar24;
        uVar24 = uVar24 - 1;
      } while (bVar15);
      uVar24 = 0;
    }
LAB_0011cd64:
    lVar25 = uVar24 - 1;
    do {
      lVar44 = lVar25 + 2;
      lVar25 = lVar25 + 1;
    } while (lVar44 * lVar44 - x / lVar44 == 0 || lVar44 * lVar44 < x / lVar44);
    uVar24 = (ulong)(dVar6 * (double)lVar25);
    lVar25 = x / (long)uVar24;
    str._M_str = (char *)(x % (long)uVar24);
    local_6f8 = 8;
    if (uVar24 < 0x14) {
      local_6f8 = (ulong)(byte)(&PhiTiny::pi)[uVar24];
    }
    if (is_print) {
      str._M_len = (size_t)"";
      print((primecount *)0x0,str);
      str_00._M_str = extraout_RDX;
      str_00._M_len = (size_t)"=== pi_lmo_parallel(x) ===";
      print((primecount *)0x1a,str_00);
      str_01._M_str = extraout_RDX_00;
      str_01._M_len = (size_t)"pi(x) = S1 + S2 + pi(y) - 1 - P2";
      print((primecount *)0x20,str_01);
      x_02._8_8_ = in_stack_fffffffffffff8b0;
      x_02._0_8_ = in_stack_fffffffffffff8a8;
      print((primecount *)x,(maxint_t)x_02,0,uVar24,lVar25,(int)local_6f8);
    }
    generate_primes_u32(&primes,uVar24);
    generate_lpf(&lpf,uVar24);
    generate_moebius(&mu,uVar24);
    local_5a8 = ((long)primes.end_ - (long)primes.array_ >> 2) + -1;
    uVar16 = P2(x,uVar24,local_5a8,threads,is_print);
    iVar17 = S1(x,uVar24,local_6f8,threads,is_print);
    Li(x);
    if (is_print) {
      str_02._M_str = extraout_RDX_01;
      str_02._M_len = (size_t)"";
      print((primecount *)0x0,str_02);
      str_03._M_str = extraout_RDX_02;
      str_03._M_len = (size_t)"=== S2(x, y) ===";
      print((primecount *)0x10,str_03);
      str_04._M_str = extraout_RDX_03;
      str_04._M_len = (size_t)"Algorithm: POPCNT64 bit counting";
      print((primecount *)0x20,str_04);
      local_5b0 = get_time();
    }
    dVar6 = pow((double)lVar25,0.27027027027027023);
    if ((int)dVar6 < threads) {
      uVar18 = (ulong)(uint)(int)dVar6;
    }
    lVar44 = lVar25 + 0xfffff;
    lVar33 = lVar25 + 0x1ffffe;
    if (-1 < lVar44) {
      lVar33 = lVar44;
    }
    uVar26 = lVar33 >> 0x14 & 0xffffffff;
    if ((long)uVar18 <= lVar33 >> 0x14) {
      uVar26 = uVar18;
    }
    if ((int)uVar18 < 1) {
      uVar26 = 1;
    }
    if (lVar44 < 0x100000) {
      uVar26 = 1;
    }
    x_00[8] = is_print;
    x_00._0_8_ = uVar26;
    x_00._9_7_ = 0;
    sum_approx._8_8_ = in_stack_fffffffffffff8b0;
    sum_approx._0_8_ = in_stack_fffffffffffff8a8;
    LoadBalancerS2::LoadBalancerS2
              (&loadBalancer,(maxint_t)x_00,x,(maxint_t)sum_approx,0,SUB81(lVar25,0));
    PiTable::PiTable(&pi,uVar24,(int)uVar26);
    local_508.low = 0;
    local_508.segments = 0;
    local_508.segment_size = 0;
    local_508.sum._0_8_ = 0;
    local_508.sum._8_8_ = 0;
    local_508.init_secs = 0.0;
    local_508.secs = 0.0;
    dVar6 = (double)(long)uVar24;
    local_590 = lVar25 + 1;
    local_598 = uVar24 - 1;
    local_5a0 = SQRT(dVar6);
    while (bVar15 = LoadBalancerS2::get_work(&loadBalancer,&local_508), bVar15) {
      local_508.secs = get_time();
      segment_size = local_508.segment_size;
      iVar14 = local_508.segments;
      low = local_508.low;
      uVar18 = 1;
      if (1 < local_508.low) {
        uVar18 = local_508.low;
      }
      uVar42 = SUB84(local_5a0,0);
      uVar43 = (undefined4)((ulong)local_5a0 >> 0x20);
      if (dVar6 < 0.0) {
        dVar7 = sqrt(dVar6);
        uVar42 = SUB84(dVar7,0);
        uVar43 = (undefined4)((ulong)dVar7 >> 0x20);
      }
      uVar26 = (ulong)(double)CONCAT44(uVar43,uVar42);
      if (0xb504f332 < (long)uVar26) {
        uVar26 = 0xb504f333;
      }
      if ((long)uVar24 < (long)(uVar26 * uVar26)) {
        do {
          uVar26 = uVar26 - 1;
        } while (uVar26 * uVar26 - uVar24 != 0 && (long)uVar24 <= (long)(uVar26 * uVar26));
      }
      else {
        lVar44 = uVar26 * 2;
        if (lVar44 < (long)(uVar24 - uVar26 * uVar26)) {
          do {
            uVar26 = uVar26 + 1;
            lVar44 = lVar44 + 2;
          } while (lVar44 < (long)(uVar24 - uVar26 * uVar26));
        }
      }
      if (uVar26 < 6) {
        uVar38 = (&BitSieve240::pi_tiny_)[uVar26];
      }
      else {
        uVar22 = uVar26 / 0xf0;
        uVar41 = pi.pi_.array_[uVar22].count;
        uVar26 = (&BitSieve240::unset_larger_)[(uint)((int)uVar26 + (int)uVar22 * -0xf0)] &
                 pi.pi_.array_[uVar22].bits;
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          uVar38 = POPCOUNT(uVar26);
        }
        else {
          uVar38 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline(uVar26);
        }
        uVar38 = uVar38 + uVar41;
      }
      uVar41 = iVar14 * segment_size + low;
      if ((long)local_590 < (long)uVar41) {
        uVar41 = local_590;
      }
      uVar18 = (ulong)x / uVar18;
      dVar7 = (double)(long)uVar18;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      uVar26 = (ulong)dVar7;
      if (0xb504f332 < (long)uVar26) {
        uVar26 = 0xb504f333;
      }
      if ((long)uVar18 < (long)(uVar26 * uVar26)) {
        do {
          uVar26 = uVar26 - 1;
        } while (uVar26 * uVar26 - uVar18 != 0 && (long)uVar18 <= (long)(uVar26 * uVar26));
      }
      else {
        lVar44 = uVar26 * 2;
        if (lVar44 < (long)(uVar18 - uVar26 * uVar26)) {
          do {
            uVar26 = uVar26 + 1;
            lVar44 = lVar44 + 2;
          } while (lVar44 < (long)(uVar18 - uVar26 * uVar26));
        }
      }
      if ((long)local_598 < (long)uVar26) {
        uVar26 = local_598;
      }
      if (uVar26 < 6) {
        uVar19 = (&BitSieve240::pi_tiny_)[uVar26];
      }
      else {
        uVar18 = uVar26 / 0xf0;
        uVar27 = pi.pi_.array_[uVar18].count;
        uVar18 = (&BitSieve240::unset_larger_)[(uint)((int)uVar26 + (int)uVar18 * -0xf0)] &
                 pi.pi_.array_[uVar18].bits;
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          uVar19 = POPCOUNT(uVar18);
        }
        else {
          uVar19 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline(uVar18);
        }
        uVar19 = uVar19 + uVar27;
      }
      uVar18 = (ulong)primes.array_[uVar19];
      if (lVar25 / (long)uVar41 < (long)(ulong)primes.array_[uVar19]) {
        uVar18 = lVar25 / (long)uVar41;
      }
      uVar26 = uVar18 & 0xffffffff;
      if (uVar26 < 6) {
        local_588 = (&BitSieve240::pi_tiny_)[uVar26];
      }
      else {
        iVar29 = (int)(uVar26 / 0xf0);
        uVar26 = (ulong)(uint)(iVar29 << 4);
        lVar44 = *(long *)((long)&(pi.pi_.array_)->count + uVar26);
        uVar18 = (&BitSieve240::unset_larger_)[(uint)((int)uVar18 + iVar29 * -0xf0)] &
                 *(ulong *)((long)&(pi.pi_.array_)->bits + uVar26);
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          uVar27 = POPCOUNT(uVar18);
        }
        else {
          uVar27 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline(uVar18);
        }
        local_588 = uVar27 + lVar44;
      }
      if ((long)local_588 <= (long)local_6f8) {
        local_588 = local_6f8;
      }
      if ((long)local_588 < (long)uVar19) {
        phi_vector(&phi,low,uVar19,&primes,&pi);
        Sieve::Sieve(&local_640,low,segment_size,uVar19);
        local_508.init_secs = get_time();
        local_508.init_secs = local_508.init_secs - local_508.secs;
        if ((long)low < (long)uVar41) {
          if ((long)uVar19 < (long)uVar38) {
            uVar38 = uVar19;
          }
          local_678 = -low;
          lVar44 = 0;
          do {
            uVar18 = local_588;
            uVar30 = low + segment_size;
            uVar27 = uVar30;
            if ((long)uVar41 < (long)uVar30) {
              uVar27 = uVar41;
            }
            uVar20 = 1;
            if (1 < (long)low) {
              uVar20 = low;
            }
            Sieve::pre_sieve<unsigned_int>(&local_640,&primes,local_588,low,uVar27);
            do {
              piVar13 = lpf.array_;
              piVar12 = mu.array_;
              uVar5 = local_640.counter_.dist;
              puVar10 = local_640.sieve_.array_;
              plVar9 = phi.array_;
              bVar8 = (anonymous_namespace)::cpu_supports_popcnt;
              i = uVar18 + 1;
              if ((long)uVar38 <= (long)uVar18) {
                if ((long)uVar18 < (long)uVar19) {
                  do {
                    puVar1 = primes.array_;
                    uVar3 = primes.array_[i];
                    uVar26 = (ulong)uVar3;
                    uVar18 = (ulong)x / (uVar20 * uVar26);
                    if ((long)uVar24 <= (long)uVar18) {
                      uVar18 = uVar24;
                    }
                    if (uVar18 < 6) {
                      lVar33 = (&BitSieve240::pi_tiny_)[uVar18];
                    }
                    else {
                      uVar22 = uVar18 / 0xf0;
                      uVar5 = pi.pi_.array_[uVar22].count;
                      uVar18 = (&BitSieve240::unset_larger_)
                               [(uint)((int)uVar18 + (int)uVar22 * -0xf0)] &
                               pi.pi_.array_[uVar22].bits;
                      if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
                        uVar40 = POPCOUNT(uVar18);
                      }
                      else {
                        uVar40 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline(uVar18);
                      }
                      lVar33 = uVar40 + uVar5;
                    }
                    puVar11 = local_640.counter_.counter.array_;
                    uVar5 = local_640.counter_.dist;
                    puVar10 = local_640.sieve_.array_;
                    plVar9 = phi.array_;
                    bVar8 = (anonymous_namespace)::cpu_supports_popcnt;
                    uVar22 = x / (long)(uVar27 * uVar26);
                    uVar18 = uVar26;
                    if ((long)uVar26 < (long)uVar22) {
                      uVar18 = uVar22;
                    }
                    uVar4 = puVar1[lVar33];
                    uVar32 = (ulong)uVar4;
                    if (uVar3 < uVar4) {
                      if ((long)uVar22 < (long)uVar32) {
                        do {
                          uVar32 = (ulong)x / (uVar32 * uVar26) - low;
                          uVar22 = local_640.prev_stop_ + 1;
                          local_640.prev_stop_ = uVar32;
                          if (uVar22 <= uVar32) {
                            if (local_640.counter_.stop <= uVar32) {
                              do {
                                local_640.counter_.stop = local_640.counter_.stop + uVar5;
                                puVar2 = puVar11 + local_640.counter_.i;
                                local_640.counter_.i = local_640.counter_.i + 1;
                                local_640.counter_.sum = local_640.counter_.sum + *puVar2;
                              } while (local_640.counter_.stop <= uVar32);
                              uVar22 = local_640.counter_.stop - uVar5;
                              local_640.count_ = local_640.counter_.sum;
                            }
                            uVar31 = uVar22 / 0xf0;
                            uVar37 = uVar32 / 0xf0;
                            uVar28 = 0xffffffffffffffff;
                            if (uVar31 == uVar37) {
                              uVar28 = *(ulong *)(Sieve::unset_larger +
                                                 (ulong)(uint)((int)uVar32 + (int)uVar37 * -0xf0) *
                                                 8);
                            }
                            uVar39 = 0;
                            if (uVar31 != uVar37) {
                              uVar39 = *(ulong *)(Sieve::unset_larger +
                                                 (ulong)(uint)((int)uVar32 + (int)uVar37 * -0xf0) *
                                                 8);
                            }
                            uVar32 = uVar28 & *(ulong *)(Sieve::unset_smaller +
                                                        (ulong)(uint)((int)uVar22 +
                                                                     (int)uVar31 * -0xf0) * 8) &
                                     *(ulong *)(puVar10 + uVar31 * 8);
                            uVar22 = *(ulong *)(puVar10 + uVar37 * 8);
                            if ((bVar8 & 1) == 0) {
                              uVar40 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline(uVar32);
                            }
                            else {
                              uVar40 = POPCOUNT(uVar32);
                            }
                            if ((bVar8 & 1) == 0) {
                              uVar35 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline
                                                 (uVar39 & uVar22);
                            }
                            else {
                              uVar35 = POPCOUNT(uVar39 & uVar22);
                            }
                            while( true ) {
                              uVar35 = uVar35 + uVar40;
                              uVar31 = uVar31 + 1;
                              if (uVar37 <= uVar31) break;
                              if ((bVar8 & 1) == 0) {
                                uVar40 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline
                                                   (*(uint64_t *)(puVar10 + uVar31 * 8));
                              }
                              else {
                                uVar40 = POPCOUNT(*(uint64_t *)(puVar10 + uVar31 * 8));
                              }
                            }
                            local_640.count_ = uVar35 + local_640.count_;
                          }
                          lVar44 = lVar44 + local_640.count_ + plVar9[i];
                          uVar32 = (ulong)puVar1[lVar33 + -1];
                          lVar33 = lVar33 + -1;
                        } while (uVar18 < uVar32);
                      }
                      phi.array_[i] = phi.array_[i] + local_640.total_count_;
                      Sieve::cross_off_count(&local_640,uVar26,i);
                    }
                  } while (((long)i < (long)uVar19) && (i = i + 1, uVar3 < uVar4));
                }
                break;
              }
              uVar26 = (ulong)primes.array_[i];
              lVar21 = x / (long)(uVar27 * uVar26);
              lVar33 = (long)uVar24 / (long)uVar26;
              if ((long)uVar24 / (long)uVar26 < lVar21) {
                lVar33 = lVar21;
              }
              uVar22 = (ulong)x / (uVar20 * uVar26);
              if ((long)uVar24 <= (long)uVar22) {
                uVar22 = uVar24;
              }
              if ((long)uVar26 < (long)uVar22) {
                if (lVar33 < (long)uVar22) {
                  local_578 = local_640.counter_.counter.array_;
                  local_580 = -local_640.counter_.dist;
                  uVar18 = uVar22;
                  do {
                    iVar29 = piVar12[uVar18];
                    if (((long)iVar29 != 0) && ((long)uVar26 < (long)piVar13[uVar18])) {
                      lVar21 = x / (long)(uVar18 * uVar26);
                      uVar28 = lVar21 - low;
                      uVar32 = local_640.prev_stop_ + 1;
                      local_640.prev_stop_ = uVar28;
                      if (uVar32 <= uVar28) {
                        if (local_640.counter_.stop <= uVar28) {
                          do {
                            local_640.counter_.stop = local_640.counter_.stop + uVar5;
                            puVar1 = local_578 + local_640.counter_.i;
                            local_640.counter_.i = local_640.counter_.i + 1;
                            local_640.counter_.sum = local_640.counter_.sum + *puVar1;
                          } while (local_640.counter_.stop <= uVar28);
                          uVar32 = local_640.counter_.stop + local_580;
                          local_640.count_ = local_640.counter_.sum;
                        }
                        uVar39 = uVar32 / 0xf0;
                        uVar31 = uVar28 / 0xf0;
                        uVar37 = 0xffffffffffffffff;
                        if (uVar39 == uVar31) {
                          uVar37 = *(ulong *)(Sieve::unset_larger +
                                             (ulong)(uint)((int)uVar28 + (int)uVar31 * -0xf0) * 8);
                        }
                        uVar34 = 0;
                        if (uVar39 != uVar31) {
                          uVar34 = *(ulong *)(Sieve::unset_larger +
                                             (ulong)(uint)((int)uVar28 + (int)uVar31 * -0xf0) * 8);
                        }
                        uVar28 = uVar37 & *(ulong *)(Sieve::unset_smaller +
                                                    (ulong)(uint)((int)uVar32 + (int)uVar39 * -0xf0)
                                                    * 8) & *(ulong *)(puVar10 + uVar39 * 8);
                        uVar32 = *(ulong *)(puVar10 + uVar31 * 8);
                        if ((bVar8 & 1) == 0) {
                          uVar40 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline(uVar28);
                        }
                        else {
                          uVar40 = POPCOUNT(uVar28);
                        }
                        if ((bVar8 & 1) == 0) {
                          uVar35 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline
                                             (uVar34 & uVar32);
                        }
                        else {
                          uVar35 = POPCOUNT(uVar34 & uVar32);
                        }
                        lVar36 = uVar35 + uVar40;
                        uVar39 = uVar39 + 1;
                        if (uVar39 < uVar31) {
                          do {
                            if ((bVar8 & 1) == 0) {
                              uVar40 = anon_unknown.dwarf_99236::popcnt64_bitwise_noinline
                                                 (*(uint64_t *)(puVar10 + uVar39 * 8));
                            }
                            else {
                              uVar40 = POPCOUNT(*(uint64_t *)(puVar10 + uVar39 * 8));
                            }
                            lVar36 = lVar36 + uVar40;
                            uVar39 = uVar39 + 1;
                          } while ((ulong)(lVar21 + local_678) / 0xf0 != uVar39);
                        }
                        local_640.count_ = lVar36 + local_640.count_;
                      }
                      lVar44 = lVar44 - (local_640.count_ + plVar9[i]) * (long)iVar29;
                    }
                    uVar18 = uVar18 - 1;
                  } while (lVar33 < (long)uVar18);
                }
                phi.array_[i] = phi.array_[i] + local_640.total_count_;
                Sieve::cross_off_count(&local_640,uVar26,i);
              }
              uVar18 = i;
            } while ((long)uVar26 < (long)uVar22);
            local_678 = local_678 - segment_size;
            low = uVar30;
          } while ((long)uVar30 < (long)uVar41);
        }
        else {
          lVar44 = 0;
        }
        operator_delete(local_640.counter_.counter.array_,
                        (long)local_640.counter_.counter.capacity_ -
                        (long)local_640.counter_.counter.array_);
        operator_delete(local_640.wheel_.array_,
                        (long)local_640.wheel_.capacity_ - (long)local_640.wheel_.array_);
        operator_delete(local_640.sieve_.array_,
                        (long)local_640.sieve_.capacity_ - (long)local_640.sieve_.array_);
        operator_delete(phi.array_,(long)phi.capacity_ - (long)phi.array_);
        in_stack_fffffffffffff8b0 = lVar44;
      }
      else {
        lVar44 = 0;
      }
      local_508.sum._8_8_ = lVar44 >> 0x3f;
      local_508.sum._0_8_ = lVar44;
      dVar7 = get_time();
      local_508.secs = dVar7 - local_508.secs;
    }
    pmVar23 = LoadBalancerS2::get_sum(&loadBalancer);
    if (is_print) {
      res_00._8_8_ = in_stack_fffffffffffff8b0;
      res_00._0_8_ = in_stack_fffffffffffff8a8;
      str_05._M_str = "S2";
      str_05._M_len = 2;
      print(str_05,(maxint_t)res_00,local_5b0);
    }
    operator_delete(pi.counts_.array_,(long)pi.counts_.capacity_ - (long)pi.counts_.array_);
    operator_delete(pi.pi_.array_,(long)pi.pi_.capacity_ - (long)pi.pi_.array_);
    lVar25 = local_5a8 + ~uVar16 + iVar17 + (long)pmVar23;
    operator_delete(mu.array_,(long)mu.capacity_ - (long)mu.array_);
    operator_delete(lpf.array_,(long)lpf.capacity_ - (long)lpf.array_);
    operator_delete(primes.array_,(long)primes.capacity_ - (long)primes.array_);
  }
  return lVar25;
}

Assistant:

int64_t pi_lmo_parallel(int64_t x,
                        int threads,
                        bool is_print)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  if (is_print)
  {
    print("");
    print("=== pi_lmo_parallel(x) ===");
    print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
    print(x, y, z, c, threads);
  }

  auto primes = generate_primes<uint32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads, is_print);
  int64_t s1 = S1(x, y, c, threads, is_print);
  int64_t s2_approx = S2_approx(x, pi_y, p2, s1);
  int64_t s2 = S2(x, y, z, c, s2_approx, primes, lpf, mu, threads, is_print);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}